

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
          (ValidationErrorTest *this,string_view file_name,string_view file_text,
          string_view expected_errors)

{
  FileDescriptor *pFVar1;
  StringLike<std::basic_string_view<char>_> *extraout_RDX;
  StringLike<std::basic_string_view<char>_> *extraout_RDX_00;
  StringLike<std::basic_string_view<char>_> *extraout_RDX_01;
  StringLike<std::basic_string_view<char>_> *extraout_RDX_02;
  StringLike<std::basic_string_view<char>_> *substring;
  StringLike<std::basic_string_view<char>_> *extraout_RDX_03;
  char *pcVar2;
  pointer *__ptr;
  MockErrorCollector error_collector;
  Message local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  AssertHelper local_1a0;
  AssertHelper local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  undefined1 local_188 [16];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  FileDescriptorProto local_158;
  MockErrorCollector local_60;
  
  pcVar2 = file_text._M_str;
  local_60.text_._M_dataplus._M_p = (pointer)&local_60.text_.field_2;
  local_60.super_ErrorCollector._vptr_ErrorCollector =
       (_func_int **)&PTR__MockErrorCollector_01883858;
  local_60.text_._M_string_length = 0;
  local_60.text_.field_2._M_local_buf[0] = '\0';
  local_60.warning_text_._M_dataplus._M_p = (pointer)&local_60.warning_text_.field_2;
  local_60.warning_text_._M_string_length = 0;
  local_60.warning_text_.field_2._M_local_buf[0] = '\0';
  ParseFile(&local_158,this,file_name,file_text);
  pFVar1 = DescriptorPool::BuildFileCollectingErrors
                     (&this->pool_,&local_158,&local_60.super_ErrorCollector);
  local_198.data_._0_1_ = (internal)(pFVar1 == (FileDescriptor *)0x0);
  local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  FileDescriptorProto::~FileDescriptorProto(&local_158);
  substring = extraout_RDX;
  if (local_198.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_158,(internal *)&local_198,
               (AssertionResult *)
               "pool_.BuildFileCollectingErrors(ParseFile(file_name, file_text), &error_collector) == nullptr"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x120a,(char *)local_158.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    substring = extraout_RDX_00;
    if ((anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)
        local_158.super_Message.super_MessageLite._vptr_MessageLite != &local_158.field_0) {
      operator_delete(local_158.super_Message.super_MessageLite._vptr_MessageLite,
                      local_158.field_0._0_8_ + 1);
      substring = extraout_RDX_01;
    }
    if ((long *)CONCAT71(local_1b0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         (char)local_1b0.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1b0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     (char)local_1b0.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
      substring = extraout_RDX_02;
    }
  }
  if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_190,local_190);
    substring = extraout_RDX_03;
  }
  testing::HasSubstr<std::basic_string_view<char,std::char_traits<char>>>
            (&local_178,(testing *)&expected_errors,substring);
  local_158.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)&local_158.field_0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,local_178.impl_.substring_._M_dataplus._M_p,
             local_178.impl_.substring_._M_dataplus._M_p +
             local_178.impl_.substring_._M_string_length);
  local_198.data_ = (AssertHelperData *)local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_158.super_Message.super_MessageLite._vptr_MessageLite,
             (long)local_158.super_Message.super_MessageLite._vptr_MessageLite +
             local_158.super_Message.super_MessageLite._internal_metadata_.ptr_);
  if ((anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)
      local_158.super_Message.super_MessageLite._vptr_MessageLite != &local_158.field_0) {
    operator_delete(local_158.super_Message.super_MessageLite._vptr_MessageLite,
                    local_158.field_0._0_8_ + 1);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&local_1b0,(char *)&local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "error_collector.text_");
  if (local_198.data_ != (AssertHelperData *)local_188) {
    operator_delete(local_198.data_,local_188._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.impl_.substring_._M_dataplus._M_p != &local_178.impl_.substring_.field_2) {
    operator_delete(local_178.impl_.substring_._M_dataplus._M_p,
                    local_178.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_1b0.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)&local_158);
    if (local_1a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_1a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x120b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if ((anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)
        local_158.super_Message.super_MessageLite._vptr_MessageLite !=
        (anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)0x0) {
      (**(code **)((long)*local_158.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a8,local_1a8);
  }
  MockErrorCollector::~MockErrorCollector(&local_60);
  return;
}

Assistant:

void ParseAndBuildFileWithErrorSubstr(absl::string_view file_name,
                                        absl::string_view file_text,
                                        absl::string_view expected_errors) {
    MockErrorCollector error_collector;
    EXPECT_TRUE(pool_.BuildFileCollectingErrors(ParseFile(file_name, file_text),
                                                &error_collector) == nullptr);
    EXPECT_THAT(error_collector.text_, HasSubstr(expected_errors));
  }